

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classes.cpp
# Opt level: O2

PyObject * PyInit_classes(void)

{
  int iVar1;
  undefined8 uVar2;
  class_<World> *this;
  class_<World> cStack_48;
  module m;
  int minor;
  int major;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  uVar2 = Py_GetVersion();
  iVar1 = __isoc99_sscanf(uVar2,"%i.%i",&major,&minor);
  if (iVar1 == 2) {
    if (minor == 10 && major == 3) {
      pybind11::module::module(&m,"classes","pybind11 class example");
      pybind11::class_<World>::class_<>
                (&cStack_48,(handle)m.super_object.super_handle.m_ptr,"World");
      pybind11::detail::init<>::execute<pybind11::class_<World>,_0>(&cStack_48);
      local_20 = World::greet_abi_cxx11_;
      local_18 = 0;
      this = pybind11::class_<World>::def<std::__cxx11::string(World::*)()>
                       (&cStack_48,"greet",(offset_in_World_to_subr *)&local_20);
      local_30 = World::set;
      local_28 = 0;
      pybind11::class_<World>::def<void(World::*)(std::__cxx11::string)>
                (this,"set",(offset_in_World_to_subr *)&local_30);
      pybind11::object::~object((object *)&cStack_48);
      pybind11::object::~object(&m.super_object);
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10);
      m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    m.super_object.super_handle.m_ptr = (object)(handle)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(classes)
{
    py::module m("classes","pybind11 class example");

    py::class_<World>(m,"World")
	.def(py::init<>())
        .def("greet", &World::greet)
        .def("set", &World::set);
return m.ptr();
}